

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_posix::num_punct_posix<wchar_t>::~num_punct_posix
          (num_punct_posix<wchar_t> *this)

{
  numpunct<wchar_t> *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__num_punct_posix_002eb850;
  std::__cxx11::string::~string((string *)(in_RDI + 0x58));
  std::__cxx11::wstring::~wstring((wstring *)(in_RDI + 0x38));
  std::__cxx11::wstring::~wstring((wstring *)(in_RDI + 0x18));
  std::__cxx11::numpunct<wchar_t>::~numpunct(in_RDI);
  return;
}

Assistant:

num_punct_posix(locale_t lc,size_t refs = 0) : 
        std::numpunct<CharType>(refs)
    {
        basic_numpunct np(lc);
        to_str(np.thousands_sep,thousands_sep_,lc);
        to_str(np.decimal_point,decimal_point_,lc);
        grouping_ = np.grouping;
        if(thousands_sep_.size() > 1)
            grouping_ = std::string();
        if(decimal_point_.size() > 1)
            decimal_point_ = CharType('.');
    }